

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_dump.h
# Opt level: O0

void dumpTokenArray(KonohaContext *kctx,int nest,kArray *a,int s,int e)

{
  undefined8 uVar1;
  int in_ECX;
  long in_RDX;
  int in_ESI;
  long in_RDI;
  int in_R8D;
  kToken *tk;
  int in_stack_00000074;
  kToken *in_stack_00000078;
  KonohaContext *in_stack_00000080;
  code *in_stack_ffffffffffffffc8;
  KonohaContext *in_stack_ffffffffffffffd0;
  long lVar2;
  undefined4 in_stack_fffffffffffffff0;
  
  if (verbose_sugar != 0) {
    if (in_ESI == 0) {
      (**(code **)(*(long *)(in_RDI + 0x10) + 0x58))(">>>\n");
    }
    for (; in_ECX < in_R8D; in_ECX = in_ECX + 1) {
      lVar2 = *(long *)(*(long *)(in_RDX + 0x20) + (long)in_ECX * 8);
      dumpIndent(in_stack_ffffffffffffffd0,(int)((ulong)in_stack_ffffffffffffffc8 >> 0x20));
      dumpToken(in_stack_00000080,in_stack_00000078,in_stack_00000074);
      if (*(int *)(*(long *)(*(long *)(lVar2 + 0x20) + 8) + 0x68) == 6) {
        dumpIndent(in_stack_ffffffffffffffd0,(int)((ulong)in_stack_ffffffffffffffc8 >> 0x20));
        in_stack_ffffffffffffffc8 = *(code **)(*(long *)(in_RDI + 0x10) + 0x58);
        uVar1 = (**(code **)(*(long *)(*(long *)(**(long **)(*(long *)(lVar2 + 0x20) + 0x20) + 0x20)
                                      + 8) + 0x20))
                          (in_RDI,*(undefined8 *)
                                   (**(long **)(*(long *)(lVar2 + 0x20) + 0x20) + 0x20));
        (*in_stack_ffffffffffffffc8)("%s\n",uVar1);
        dumpTokenArray((KonohaContext *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
                       (int)((ulong)in_RDX >> 0x20),(kArray *)CONCAT44(in_ECX,in_R8D),
                       (int)((ulong)lVar2 >> 0x20),(int)lVar2);
        dumpIndent(in_stack_ffffffffffffffd0,(int)((ulong)in_stack_ffffffffffffffc8 >> 0x20));
        in_stack_ffffffffffffffd0 = *(KonohaContext **)(*(long *)(in_RDI + 0x10) + 0x58);
        uVar1 = (**(code **)(*(long *)(*(long *)(*(long *)(*(long *)(*(long *)(lVar2 + 0x20) + 0x20)
                                                          + ((*(ulong *)(*(long *)(lVar2 + 0x20) +
                                                                        0x18) >> 3) - 1) * 8) + 0x20
                                                ) + 8) + 0x20))
                          (in_RDI,*(undefined8 *)
                                   (*(long *)(*(long *)(*(long *)(lVar2 + 0x20) + 0x20) +
                                             ((*(ulong *)(*(long *)(lVar2 + 0x20) + 0x18) >> 3) - 1)
                                             * 8) + 0x20));
        (*(code *)in_stack_ffffffffffffffd0)("%s\n",uVar1);
      }
    }
    if (in_ESI == 0) {
      (**(code **)(*(long *)(in_RDI + 0x10) + 0x58))("<<<\n");
    }
  }
  return;
}

Assistant:

static void dumpTokenArray(KonohaContext *kctx, int nest, kArray *a, int s, int e)
{
	if(verbose_sugar) {
		if(nest == 0) DUMP_P(">>>\n");
		while(s < e) {
			kToken *tk = a->TokenItems[s];
			dumpIndent(kctx, nest);
			dumpToken(kctx, tk, s);
			if(IS_Array(tk->GroupTokenList)) {
				dumpIndent(kctx, nest);
				DUMP_P("%s\n", kString_text(tk->GroupTokenList->TokenItems[0]->text));
				dumpTokenArray(kctx, nest+1, RangeGroup(tk->GroupTokenList));
				dumpIndent(kctx, nest);
				DUMP_P("%s\n", kString_text(tk->GroupTokenList->TokenItems[kArray_size(tk->GroupTokenList)-1]->text));
			}
			s++;
		}
		if(nest == 0) DUMP_P("<<<\n");
	}
}